

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void sync_enc_workers(MultiThreadInfo *mt_info,AV1_COMMON *cm,int num_workers)

{
  AVxWorker *pAVar1;
  AVxWorker *pAVar2;
  long lVar3;
  int iVar4;
  AVxWorkerInterface *pAVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  pAVar5 = aom_get_worker_interface();
  pAVar1 = mt_info->workers;
  iVar8 = pAVar1->had_error;
  if (iVar8 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar1->data1 + 0x18),0x1a0);
  }
  uVar7 = (ulong)(uint)num_workers;
  bVar9 = iVar8 == 0;
  do {
    iVar8 = (int)uVar7 + 1;
    lVar3 = uVar7 * 0x38;
    do {
      lVar6 = lVar3;
      iVar8 = iVar8 + -1;
      if (iVar8 < 2) {
        if (!bVar9) {
          aom_internal_error_copy(cm->error,&local_1d0);
        }
        *(aom_internal_error_info **)(*(long *)((long)pAVar1->data1 + 8) + 0x2b90) = cm->error;
        return;
      }
      uVar7 = uVar7 - 1;
      pAVar2 = mt_info->workers;
      iVar4 = (*pAVar5->sync)((AVxWorker *)((long)&pAVar2[-1].impl_ + lVar6));
      lVar3 = lVar6 + -0x38;
    } while (iVar4 != 0);
    memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar2[-1].data1 + lVar6) + 0x18),0x1a0);
    bVar9 = false;
  } while( true );
}

Assistant:

static inline void sync_enc_workers(MultiThreadInfo *const mt_info,
                                    AV1_COMMON *const cm, int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  const AVxWorker *const worker_main = &mt_info->workers[0];
  int had_error = worker_main->had_error;
  struct aom_internal_error_info error_info;

  // Read the error_info of main thread.
  if (had_error) {
    error_info = ((EncWorkerData *)worker_main->data1)->error_info;
  }

  // Encoding ends.
  for (int i = num_workers - 1; i > 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    if (!winterface->sync(worker)) {
      had_error = 1;
      error_info = ((EncWorkerData *)worker->data1)->error_info;
    }
  }

  if (had_error) aom_internal_error_copy(cm->error, &error_info);

  // Restore xd->error_info of the main thread back to cm->error so that the
  // multithreaded code, when executed using a single thread, has a valid
  // xd->error_info.
  MACROBLOCKD *const xd = &((EncWorkerData *)worker_main->data1)->td->mb.e_mbd;
  xd->error_info = cm->error;
}